

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_NoiseBox.cpp
# Opt level: O0

int NoiseBox::InternalRegisterEffectDefinition(UnityAudioEffectDefinition *definition)

{
  ulong uVar1;
  UnityAudioParameterDefinition *pUVar2;
  int numparams;
  UnityAudioEffectDefinition *definition_local;
  
  uVar1 = SUB168(ZEXT816(4) * ZEXT816(0x40),0);
  if (SUB168(ZEXT816(4) * ZEXT816(0x40),8) != 0) {
    uVar1 = 0xffffffffffffffff;
  }
  pUVar2 = (UnityAudioParameterDefinition *)operator_new__(uVar1);
  definition->paramdefs = pUVar2;
  RegisterParameter(definition,"Add Amount","dB",-100.0,0.0,-50.0,1.0,1.0,0,
                    "Gain of additive noise in dB");
  RegisterParameter(definition,"Mul Amount","dB",-100.0,0.0,-50.0,1.0,1.0,1,
                    "Gain of multiplicative noise in dB");
  RegisterParameter(definition,"Add Frequency","Hz",0.001,24000.0,5000.0,1.0,3.0,2,
                    "Additive noise frequency cutoff in Hz");
  RegisterParameter(definition,"Mul Frequency","Hz",0.001,24000.0,50.0,1.0,3.0,3,
                    "Multiplicative noise frequency cutoff in Hz");
  return 4;
}

Assistant:

int InternalRegisterEffectDefinition(UnityAudioEffectDefinition& definition)
    {
        int numparams = P_NUM;
        definition.paramdefs = new UnityAudioParameterDefinition[numparams];
        RegisterParameter(definition, "Add Amount", "dB", -100.0f, 0.0f, -50.0f, 1.0f, 1.0f, P_ADDAMT, "Gain of additive noise in dB");
        RegisterParameter(definition, "Mul Amount", "dB", -100.0f, 0.0f, -50.0f, 1.0f, 1.0f, P_MULAMT, "Gain of multiplicative noise in dB");
        RegisterParameter(definition, "Add Frequency", "Hz", 0.001f, 24000.0f, 5000.0f, 1.0f, 3.0f, P_ADDFREQ, "Additive noise frequency cutoff in Hz");
        RegisterParameter(definition, "Mul Frequency", "Hz", 0.001f, 24000.0f, 50.0f, 1.0f, 3.0f, P_MULFREQ, "Multiplicative noise frequency cutoff in Hz");
        return numparams;
    }